

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void wstran_accept_cb(void *arg)

{
  nng_stream *s;
  nng_stream *ws;
  ws_pipe *p;
  nni_aio *pnStack_28;
  int rv;
  nni_aio *uaio;
  nni_aio *aaio;
  ws_listener *l;
  void *arg_local;
  
  uaio = (nni_aio *)((long)arg + 0x48);
  aaio = (nni_aio *)arg;
  l = (ws_listener *)arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 0x20));
  s = (nng_stream *)nni_aio_get_output(uaio,0);
  pnStack_28 = (nni_aio *)nni_list_first((nni_list *)&aaio->a_expire);
  p._4_4_ = nni_aio_result(uaio);
  if (p._4_4_ == NNG_OK) {
    p._4_4_ = nni_pipe_alloc_listener(&ws,(nni_listener *)aaio[1].a_task.task_mtx.mtx.__align);
    if (p._4_4_ == NNG_OK) {
      *(short *)((long)&ws->s_get + 2) = (short)aaio->a_count;
      ws[0x11].s_recv = (_func_void_void_ptr_nng_aio_ptr *)s;
      nni_list_append((nni_list *)((long)&aaio[1].a_task.task_mtx.mtx + 8),ws);
      wstran_listener_match((ws_listener *)aaio);
      nng_stream_listener_accept(*(nng_stream_listener **)&aaio[1].a_task.task_busy,uaio);
      nni_mtx_unlock((nni_mtx *)&aaio->a_task);
      return;
    }
    nng_stream_free(s);
  }
  pnStack_28 = (nni_aio *)nni_list_first((nni_list *)&aaio->a_expire);
  if (pnStack_28 != (nni_aio *)0x0) {
    nni_aio_list_remove(pnStack_28);
    nni_aio_finish_error(pnStack_28,p._4_4_);
  }
  if (p._4_4_ != NNG_ECLOSED) {
    nng_stream_listener_accept(*(nng_stream_listener **)&aaio[1].a_task.task_busy,uaio);
  }
  nni_mtx_unlock((nni_mtx *)&aaio->a_task);
  return;
}

Assistant:

static void
wstran_accept_cb(void *arg)
{
	ws_listener *l    = arg;
	nni_aio     *aaio = &l->accaio;
	nni_aio     *uaio;
	int          rv;
	ws_pipe     *p;
	nng_stream  *ws;

	nni_mtx_lock(&l->mtx);

	ws   = nni_aio_get_output(aaio, 0);
	uaio = nni_list_first(&l->aios);
	if ((rv = nni_aio_result(aaio)) != 0) {
		goto error;
	}

	rv = nni_pipe_alloc_listener((void **) &p, l->nlistener);
	if (rv != 0) {
		nng_stream_free(ws);
		goto error;
	}
	p->peer = l->peer;
	p->ws   = ws;

	nni_list_append(&l->wait_pipes, p);
	wstran_listener_match(l);
	nng_stream_listener_accept(l->listener, aaio);
	nni_mtx_unlock(&l->mtx);
	return;

error:

	// possibly report this upstream
	if ((uaio = nni_list_first(&l->aios)) != NULL) {
		nni_aio_list_remove(uaio);
		nni_aio_finish_error(uaio, rv);
	}
	if (rv != NNG_ECLOSED) {
		nng_stream_listener_accept(l->listener, aaio);
	}
	nni_mtx_unlock(&l->mtx);
}